

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string_view name,string_view relative_to,ResolveMode resolve_mode
          ,bool build_it)

{
  string_view pc;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view sVar6;
  AlphaNum local_188;
  string_view local_158;
  char *local_148;
  size_t sStack_140;
  AlphaNum local_138;
  AlphaNum local_108;
  ulong local_d8;
  size_type old_size;
  char *local_c8;
  size_t sStack_c0;
  ulong local_b8;
  size_type dot_pos;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string scope_to_try;
  char *local_70;
  undefined1 auStack_68 [8];
  string_view first_part_of_name;
  size_type name_dot_pos;
  bool build_it_local;
  ResolveMode resolve_mode_local;
  DescriptorBuilder *this_local;
  string_view relative_to_local;
  string_view name_local;
  Symbol result;
  
  relative_to_local._M_len = (size_t)relative_to._M_str;
  this_local = (DescriptorBuilder *)relative_to._M_len;
  name_local._M_len = (size_t)name._M_str;
  relative_to_local._M_str = (char *)name._M_len;
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  std::__cxx11::string::clear();
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&relative_to_local._M_str);
  if ((bVar1) ||
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &relative_to_local._M_str,0), *pvVar2 != '.')) {
    first_part_of_name._M_str =
         (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &relative_to_local._M_str,'.',0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
    if (first_part_of_name._M_str == (char *)0xffffffffffffffff) {
      auStack_68 = (undefined1  [8])relative_to_local._M_str;
      first_part_of_name._M_len = name_local._M_len;
    }
    else {
      join_0x00000010_0x00000000_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&relative_to_local._M_str,
                      0,(size_type)first_part_of_name._M_str);
      auStack_68 = (undefined1  [8])scope_to_try.field_2._8_8_;
      first_part_of_name._M_len = (size_t)local_70;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_98,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_99);
    std::allocator<char>::~allocator(&local_99);
    while( true ) {
      local_b8 = std::__cxx11::string::find_last_of((char)local_98,0x2e);
      if (local_b8 == 0xffffffffffffffff) break;
      std::__cxx11::string::erase((ulong)local_98,local_b8);
      local_d8 = std::__cxx11::string::size();
      absl::lts_20250127::AlphaNum::AlphaNum(&local_108,".");
      local_148 = (char *)auStack_68;
      sStack_140 = first_part_of_name._M_len;
      pc._M_str = (char *)first_part_of_name._M_len;
      pc._M_len = (size_t)auStack_68;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_138,pc);
      absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_98,&local_108,&local_138);
      sVar6 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      local_158 = sVar6;
      name_local._M_str = (char *)FindSymbol(this,sVar6,build_it);
      bVar1 = Symbol::IsNull((Symbol *)&name_local._M_str);
      if (!bVar1) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &relative_to_local._M_str);
        if (sVar3 < sVar4) {
          bVar1 = Symbol::IsAggregate((Symbol *)&name_local._M_str);
          if (bVar1) {
            sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
            bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &relative_to_local._M_str,sVar3,0xffffffffffffffff);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_188,bVar5);
            absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_98,&local_188);
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
            name_local._M_str = (char *)FindSymbol(this,sVar6,build_it);
            bVar1 = Symbol::IsNull((Symbol *)&name_local._M_str);
            if (bVar1) {
              std::__cxx11::string::operator=
                        ((string *)&this->undefine_resolved_name_,(string *)local_98);
            }
            goto LAB_002edb7a;
          }
        }
        else {
          if (resolve_mode != LOOKUP_TYPES) goto LAB_002edb7a;
          bVar1 = Symbol::IsType((Symbol *)&name_local._M_str);
          if (bVar1) goto LAB_002edb7a;
        }
      }
      std::__cxx11::string::erase((ulong)local_98,local_d8);
    }
    local_c8 = relative_to_local._M_str;
    sStack_c0 = name_local._M_len;
    sVar6._M_str = (char *)name_local._M_len;
    sVar6._M_len = (size_t)relative_to_local._M_str;
    name_local._M_str = (char *)FindSymbol(this,sVar6,build_it);
LAB_002edb7a:
    old_size._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&relative_to_local._M_str
                       ,1,0xffffffffffffffff);
    name_local._M_str = (char *)FindSymbol(this,bVar5,build_it);
  }
  return (Symbol)(SymbolBase *)name_local._M_str;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const absl::string_view name, const absl::string_view relative_to,
    ResolveMode resolve_mode, bool build_it) {
  possible_undeclared_dependency_ = nullptr;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  std::string::size_type name_dot_pos = name.find_first_of('.');
  absl::string_view first_part_of_name;
  if (name_dot_pos == std::string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  std::string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    std::string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == std::string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    std::string::size_type old_size = scope_to_try.size();
    absl::StrAppend(&scope_to_try, ".", first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          absl::StrAppend(&scope_to_try,
                          name.substr(first_part_of_name.size()));
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}